

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddLanguageFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,cmBuildStep compileOrLink,
          string *lang,string *config)

{
  cmAlphaNum *this_00;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  cmMakefile *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  bool bVar4;
  string *psVar5;
  long lVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  byte local_f89;
  byte local_f2a;
  byte local_e92;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_dc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d60;
  cmAlphaNum local_bb8;
  cmAlphaNum local_b88;
  string local_b58;
  basic_string_view<char,_std::char_traits<char>_> local_b38;
  basic_string_view<char,_std::char_traits<char>_> local_b28;
  byte local_b11;
  cmAlphaNum local_b10;
  cmAlphaNum local_ae0;
  string local_ab0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_a90;
  basic_string_view<char,_std::char_traits<char>_> local_a80;
  basic_string_view<char,_std::char_traits<char>_> local_a70;
  cmAlphaNum local_a60;
  cmAlphaNum local_a30;
  string local_a00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_9e0;
  cmAlphaNum local_9d0;
  cmAlphaNum local_9a0;
  string local_970;
  cmValue local_950;
  cmValue msvcDebugInformationFormatOptions;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  msvcDebugInformationFormat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  byte local_89a;
  byte local_899;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  cmValue local_7b8;
  cmValue watcomRuntimeLibraryOptions;
  string local_790;
  undefined1 local_770 [8];
  string watcomRuntimeLibrary;
  string local_748;
  cmValue local_728;
  cmValue watcomRuntimeLibraryValue;
  allocator<char> local_711;
  string local_710;
  cmValue local_6f0;
  cmValue watcomRuntimeLibraryDefault;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  byte local_662;
  byte local_661;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  cmValue local_580;
  cmValue msvcRuntimeLibraryOptions;
  string local_558;
  undefined1 local_538 [8];
  string msvcRuntimeLibrary;
  string local_510;
  cmValue local_4f0;
  cmValue msvcRuntimeLibraryValue;
  allocator<char> local_4d9;
  string local_4d8;
  cmValue local_4b8;
  cmValue msvcRuntimeLibraryDefault;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  string local_480 [32];
  iterator local_460;
  size_type local_458;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_450;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_435;
  undefined1 local_434;
  allocator<char> local_433;
  allocator<char> local_432;
  allocator<char> local_431;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  iterator local_3a8;
  size_type local_3a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  allocator<char> local_379;
  string local_378;
  cmValue local_358;
  cmValue vfsOverlay;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  byte local_2ab;
  byte local_2aa;
  allocator<char> local_2a9;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  allocator<char> local_261;
  string local_260;
  cmValue local_240;
  allocator<char> local_231;
  string local_230;
  cmValue local_210;
  cmValue v;
  cmAlphaNum local_1d8;
  string local_1a8;
  undefined1 local_188 [8];
  string compilerSimulateId;
  cmAlphaNum local_138;
  string local_108;
  undefined1 local_e8 [8];
  string compiler;
  cmAlphaNum local_b8;
  cmAlphaNum local_88;
  string local_58;
  string *local_38;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *pcStack_20;
  cmBuildStep compileOrLink_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  local_38 = config;
  config_local = lang;
  lang_local._4_4_ = compileOrLink;
  pcStack_20 = target;
  target_local = (cmGeneratorTarget *)flags;
  flags_local = (string *)this;
  cmAlphaNum::cmAlphaNum(&local_88,"CMAKE_");
  cmAlphaNum::cmAlphaNum(&local_b8,config_local);
  cmStrCat<char[7]>(&local_58,&local_88,&local_b8,(char (*) [7])0xd1c770);
  AddConfigVariableFlags(this,flags,&local_58,local_38);
  std::__cxx11::string::~string((string *)&local_58);
  pcVar1 = this->Makefile;
  cmAlphaNum::cmAlphaNum(&local_138,"CMAKE_");
  this_00 = (cmAlphaNum *)((long)&compilerSimulateId.field_2 + 8);
  cmAlphaNum::cmAlphaNum(this_00,config_local);
  cmStrCat<char[13]>(&local_108,&local_138,this_00,(char (*) [13])0xd5953f);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_108);
  std::__cxx11::string::string((string *)local_e8,(string *)psVar5);
  std::__cxx11::string::~string((string *)&local_108);
  pcVar1 = this->Makefile;
  cmAlphaNum::cmAlphaNum(&local_1d8,"CMAKE_");
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&v,config_local);
  cmStrCat<char[13]>(&local_1a8,&local_1d8,(cmAlphaNum *)&v,(char (*) [13])0xd2cfef);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_1a8);
  std::__cxx11::string::string((string *)local_188,(string *)psVar5);
  std::__cxx11::string::~string((string *)&local_1a8);
  bVar3 = std::operator==(config_local,"Swift");
  pcVar2 = pcStack_20;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"Swift_LANGUAGE_VERSION",&local_231);
    local_210 = cmGeneratorTarget::GetProperty(pcVar2,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
    bVar3 = cmValue::operator_cast_to_bool(&local_210);
    if (bVar3) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_260,"CMAKE_Swift_COMPILER_VERSION",&local_261);
      local_240 = cmMakefile::GetDefinition(pcVar1,&local_260);
      psVar5 = cmValue::operator_cast_to_string_(&local_240);
      bVar3 = cmSystemTools::VersionCompare(OP_GREATER_EQUAL,psVar5,"4.2");
      std::__cxx11::string::~string((string *)&local_260);
      std::allocator<char>::~allocator(&local_261);
      pcVar2 = target_local;
      if (bVar3) {
        psVar5 = cmValue::operator*[abi_cxx11_(&local_210);
        std::operator+(&local_288,"-swift-version ",psVar5);
        (*this->_vptr_cmLocalGenerator[6])(this,pcVar2,&local_288);
        std::__cxx11::string::~string((string *)&local_288);
      }
    }
  }
  else {
    bVar3 = std::operator==(config_local,"CUDA");
    if (bVar3) {
      cmGeneratorTarget::AddCUDAArchitectureFlags
                (pcStack_20,lang_local._4_4_,local_38,(string *)target_local);
      cmGeneratorTarget::AddCUDAToolkitFlags(pcStack_20,(string *)target_local);
    }
    else {
      bVar3 = std::operator==(config_local,"ISPC");
      if (bVar3) {
        cmGeneratorTarget::AddISPCTargetFlags(pcStack_20,(string *)target_local);
      }
      else {
        local_2aa = 0;
        local_2ab = 0;
        bVar4 = std::operator==(config_local,"RC");
        bVar3 = false;
        if (bVar4) {
          pcVar1 = this->Makefile;
          std::allocator<char>::allocator();
          local_2aa = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a8,"CMAKE_RC_COMPILER",&local_2a9);
          local_2ab = 1;
          psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_2a8);
          lVar6 = std::__cxx11::string::find((char *)psVar5,0xd2cfcc);
          bVar3 = lVar6 != -1;
        }
        if ((local_2ab & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_2a8);
        }
        if ((local_2aa & 1) != 0) {
          std::allocator<char>::~allocator(&local_2a9);
        }
        if (bVar3) {
          pcVar1 = this->Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d0,"CMAKE_C_COMPILER_ID",&local_2d1);
          psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_2d0);
          std::__cxx11::string::operator=((string *)local_e8,(string *)psVar5);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::allocator<char>::~allocator(&local_2d1);
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            pcVar1 = this->Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2f8,"CMAKE_C_SIMULATE_ID",&local_2f9);
            psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_2f8);
            std::__cxx11::string::operator=((string *)local_188,(string *)psVar5);
            std::__cxx11::string::~string((string *)&local_2f8);
            std::allocator<char>::~allocator(&local_2f9);
          }
          else {
            pcVar1 = this->Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_320,"CMAKE_CXX_COMPILER_ID",&local_321);
            psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_320);
            std::__cxx11::string::operator=((string *)local_e8,(string *)psVar5);
            std::__cxx11::string::~string((string *)&local_320);
            std::allocator<char>::~allocator(&local_321);
            pcVar1 = this->Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_348,"CMAKE_CXX_SIMULATE_ID",
                       (allocator<char> *)((long)&vfsOverlay.Value + 7));
            psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_348);
            std::__cxx11::string::operator=((string *)local_188,(string *)psVar5);
            std::__cxx11::string::~string((string *)&local_348);
            std::allocator<char>::~allocator((allocator<char> *)((long)&vfsOverlay.Value + 7));
          }
        }
        else {
          bVar3 = std::operator==(config_local,"HIP");
          if (bVar3) {
            cmGeneratorTarget::AddHIPArchitectureFlags(pcStack_20,(string *)target_local);
          }
        }
      }
    }
  }
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_e8,"Clang");
  if (bVar3) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,"CMAKE_CLANG_VFS_OVERLAY",&local_379);
    local_358 = cmMakefile::GetDefinition(pcVar1,&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator(&local_379);
    bVar3 = cmValue::operator_cast_to_bool(&local_358);
    if (bVar3) {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_188,"MSVC");
      pcVar2 = target_local;
      if (bVar3) {
        local_434 = 1;
        local_430 = &local_428;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_428,"-Xclang",&local_431);
        local_430 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_408,"-ivfsoverlay",&local_432);
        local_430 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_3e8,"-Xclang",&local_433);
        local_430 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8;
        psVar5 = cmValue::operator*[abi_cxx11_(&local_358);
        std::__cxx11::string::string(local_3c8,(string *)psVar5);
        local_434 = 0;
        local_3a8 = &local_428;
        local_3a0 = 4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_435);
        __l_00._M_len = local_3a0;
        __l_00._M_array = local_3a8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_398,__l_00,&local_435);
        AppendCompileOptions(this,(string *)pcVar2,&local_398,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_398);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_435);
        local_d60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8;
        do {
          local_d60 = local_d60 + -1;
          std::__cxx11::string::~string((string *)local_d60);
        } while (local_d60 != &local_428);
        std::allocator<char>::~allocator(&local_433);
        std::allocator<char>::~allocator(&local_432);
        std::allocator<char>::~allocator(&local_431);
      }
      else {
        msvcRuntimeLibraryDefault.Value._6_1_ = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4a0,"-ivfsoverlay",
                   (allocator<char> *)((long)&msvcRuntimeLibraryDefault.Value + 7));
        psVar5 = cmValue::operator*[abi_cxx11_(&local_358);
        std::__cxx11::string::string(local_480,(string *)psVar5);
        msvcRuntimeLibraryDefault.Value._6_1_ = 0;
        local_460 = &local_4a0;
        local_458 = 2;
        this_01 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&msvcRuntimeLibraryDefault.Value + 5);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(this_01);
        __l._M_len = local_458;
        __l._M_array = local_460;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_450,__l,this_01);
        AppendCompileOptions(this,(string *)pcVar2,&local_450,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_450);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&msvcRuntimeLibraryDefault.Value + 5));
        local_dc8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_460;
        do {
          local_dc8 = local_dc8 + -1;
          std::__cxx11::string::~string((string *)local_dc8);
        } while (local_dc8 != &local_4a0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)&msvcRuntimeLibraryDefault.Value + 7));
      }
    }
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,"CMAKE_MSVC_RUNTIME_LIBRARY_DEFAULT",&local_4d9);
  local_4b8 = cmMakefile::GetDefinition(pcVar1,&local_4d8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  msvcRuntimeLibraryValue.Value = local_4b8.Value;
  bVar3 = cmNonempty(local_4b8);
  pcVar2 = pcStack_20;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_510,"MSVC_RUNTIME_LIBRARY",
               (allocator<char> *)(msvcRuntimeLibrary.field_2._M_local_buf + 0xf));
    local_4f0 = cmGeneratorTarget::GetProperty(pcVar2,&local_510);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator
              ((allocator<char> *)(msvcRuntimeLibrary.field_2._M_local_buf + 0xf));
    bVar3 = cmValue::operator_cast_to_bool(&local_4f0);
    if (!bVar3) {
      local_4f0.Value = local_4b8.Value;
    }
    psVar5 = cmValue::operator*[abi_cxx11_(&local_4f0);
    std::__cxx11::string::string((string *)&local_558,(string *)psVar5);
    pcVar2 = pcStack_20;
    psVar5 = local_38;
    std::__cxx11::string::string((string *)&msvcRuntimeLibraryOptions);
    cmGeneratorExpression::Evaluate
              ((string *)local_538,&local_558,this,psVar5,pcVar2,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
               (string *)&msvcRuntimeLibraryOptions);
    std::__cxx11::string::~string((string *)&msvcRuntimeLibraryOptions);
    std::__cxx11::string::~string((string *)&local_558);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      pcVar1 = this->Makefile;
      std::operator+(&local_5e0,"CMAKE_",config_local);
      std::operator+(&local_5c0,&local_5e0,"_COMPILE_OPTIONS_MSVC_RUNTIME_LIBRARY_");
      std::operator+(&local_5a0,&local_5c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538)
      ;
      local_580 = cmMakefile::GetDefinition(pcVar1,&local_5a0);
      std::__cxx11::string::~string((string *)&local_5a0);
      std::__cxx11::string::~string((string *)&local_5c0);
      std::__cxx11::string::~string((string *)&local_5e0);
      bVar3 = cmValue::operator_cast_to_bool(&local_580);
      pcVar2 = target_local;
      if (bVar3) {
        psVar5 = cmValue::operator*[abi_cxx11_(&local_580);
        AppendCompileOptions(this,(string *)pcVar2,psVar5,(char *)0x0);
      }
      else {
        pcVar1 = this->Makefile;
        local_661 = 0;
        local_662 = 0;
        std::operator+(&local_620,"CMAKE_",config_local);
        std::operator+(&local_600,&local_620,"_COMPILER_ID");
        psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_600);
        bVar3 = std::operator==(psVar5,"MSVC");
        if (bVar3) {
LAB_003e0d6d:
          bVar3 = cmSystemTools::GetErrorOccurredFlag();
          local_e92 = bVar3 ^ 0xff;
        }
        else {
          pcVar1 = this->Makefile;
          std::operator+(&local_660,"CMAKE_",config_local);
          local_661 = 1;
          std::operator+(&local_640,&local_660,"_SIMULATE_ID");
          local_662 = 1;
          psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_640);
          bVar3 = std::operator==(psVar5,"MSVC");
          local_e92 = 0;
          if (bVar3) goto LAB_003e0d6d;
        }
        if ((local_662 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_640);
        }
        if ((local_661 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_660);
        }
        std::__cxx11::string::~string((string *)&local_600);
        std::__cxx11::string::~string((string *)&local_620);
        if ((local_e92 & 1) != 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &watcomRuntimeLibraryDefault,"MSVC_RUNTIME_LIBRARY value \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_538);
          std::operator+(&local_6c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &watcomRuntimeLibraryDefault,"\' not known for this ");
          std::operator+(&local_6a8,&local_6c8,config_local);
          std::operator+(&local_688,&local_6a8," compiler.");
          IssueMessage(this,FATAL_ERROR,&local_688);
          std::__cxx11::string::~string((string *)&local_688);
          std::__cxx11::string::~string((string *)&local_6a8);
          std::__cxx11::string::~string((string *)&local_6c8);
          std::__cxx11::string::~string((string *)&watcomRuntimeLibraryDefault);
        }
      }
    }
    std::__cxx11::string::~string((string *)local_538);
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_710,"CMAKE_WATCOM_RUNTIME_LIBRARY_DEFAULT",&local_711);
  local_6f0 = cmMakefile::GetDefinition(pcVar1,&local_710);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator(&local_711);
  watcomRuntimeLibraryValue.Value = local_6f0.Value;
  bVar3 = cmNonempty(local_6f0);
  pcVar2 = pcStack_20;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_748,"WATCOM_RUNTIME_LIBRARY",
               (allocator<char> *)(watcomRuntimeLibrary.field_2._M_local_buf + 0xf));
    local_728 = cmGeneratorTarget::GetProperty(pcVar2,&local_748);
    std::__cxx11::string::~string((string *)&local_748);
    std::allocator<char>::~allocator
              ((allocator<char> *)(watcomRuntimeLibrary.field_2._M_local_buf + 0xf));
    bVar3 = cmValue::operator_cast_to_bool(&local_728);
    if (!bVar3) {
      local_728.Value = local_6f0.Value;
    }
    psVar5 = cmValue::operator*[abi_cxx11_(&local_728);
    std::__cxx11::string::string((string *)&local_790,(string *)psVar5);
    pcVar2 = pcStack_20;
    psVar5 = local_38;
    std::__cxx11::string::string((string *)&watcomRuntimeLibraryOptions);
    cmGeneratorExpression::Evaluate
              ((string *)local_770,&local_790,this,psVar5,pcVar2,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
               (string *)&watcomRuntimeLibraryOptions);
    std::__cxx11::string::~string((string *)&watcomRuntimeLibraryOptions);
    std::__cxx11::string::~string((string *)&local_790);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      pcVar1 = this->Makefile;
      std::operator+(&local_818,"CMAKE_",config_local);
      std::operator+(&local_7f8,&local_818,"_COMPILE_OPTIONS_WATCOM_RUNTIME_LIBRARY_");
      std::operator+(&local_7d8,&local_7f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_770)
      ;
      local_7b8 = cmMakefile::GetDefinition(pcVar1,&local_7d8);
      std::__cxx11::string::~string((string *)&local_7d8);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_818);
      bVar3 = cmValue::operator_cast_to_bool(&local_7b8);
      pcVar2 = target_local;
      if (bVar3) {
        psVar5 = cmValue::operator*[abi_cxx11_(&local_7b8);
        AppendCompileOptions(this,(string *)pcVar2,psVar5,(char *)0x0);
      }
      else {
        pcVar1 = this->Makefile;
        local_899 = 0;
        local_89a = 0;
        std::operator+(&local_858,"CMAKE_",config_local);
        std::operator+(&local_838,&local_858,"_COMPILER_ID");
        psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_838);
        bVar3 = std::operator==(psVar5,"OpenWatcom");
        if (bVar3) {
LAB_003e155c:
          bVar3 = cmSystemTools::GetErrorOccurredFlag();
          local_f2a = bVar3 ^ 0xff;
        }
        else {
          pcVar1 = this->Makefile;
          std::operator+(&local_898,"CMAKE_",config_local);
          local_899 = 1;
          std::operator+(&local_878,&local_898,"_SIMULATE_ID");
          local_89a = 1;
          psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_878);
          bVar3 = std::operator==(psVar5,"OpenWatcom");
          local_f2a = 0;
          if (bVar3) goto LAB_003e155c;
        }
        if ((local_89a & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_878);
        }
        if ((local_899 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_898);
        }
        std::__cxx11::string::~string((string *)&local_838);
        std::__cxx11::string::~string((string *)&local_858);
        if ((local_f2a & 1) != 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &msvcDebugInformationFormat.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_engaged,"WATCOM_RUNTIME_LIBRARY value \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_770);
          std::operator+(&local_900,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &msvcDebugInformationFormat.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_engaged,"\' not known for this ");
          std::operator+(&local_8e0,&local_900,config_local);
          std::operator+(&local_8c0,&local_8e0," compiler.");
          IssueMessage(this,FATAL_ERROR,&local_8c0);
          std::__cxx11::string::~string((string *)&local_8c0);
          std::__cxx11::string::~string((string *)&local_8e0);
          std::__cxx11::string::~string((string *)&local_900);
          std::__cxx11::string::~string
                    ((string *)
                     &msvcDebugInformationFormat.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_engaged);
        }
      }
    }
    std::__cxx11::string::~string((string *)local_770);
  }
  GetMSVCDebugFormatName
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&msvcDebugInformationFormatOptions,this,local_38,pcStack_20);
  bVar3 = std::optional::operator_cast_to_bool((optional *)&msvcDebugInformationFormatOptions);
  if (!bVar3) goto LAB_003e1cda;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&msvcDebugInformationFormatOptions);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) != 0) goto LAB_003e1cda;
  pcVar1 = this->Makefile;
  cmAlphaNum::cmAlphaNum(&local_9a0,"CMAKE_");
  cmAlphaNum::cmAlphaNum(&local_9d0,config_local);
  pbVar8 = std::
           optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&msvcDebugInformationFormatOptions);
  cmStrCat<char[48],std::__cxx11::string>
            (&local_970,&local_9a0,&local_9d0,
             (char (*) [48])"_COMPILE_OPTIONS_MSVC_DEBUG_INFORMATION_FORMAT_",pbVar8);
  local_950 = cmMakefile::GetDefinition(pcVar1,&local_970);
  std::__cxx11::string::~string((string *)&local_970);
  bVar3 = cmValue::operator_cast_to_bool(&local_950);
  pcVar2 = target_local;
  if (bVar3) {
    psVar5 = cmValue::operator*[abi_cxx11_(&local_950);
    AppendCompileOptions(this,(string *)pcVar2,psVar5,(char *)0x0);
    goto LAB_003e1cda;
  }
  pcVar1 = this->Makefile;
  local_b11 = 0;
  cmAlphaNum::cmAlphaNum(&local_a30,"CMAKE_");
  cmAlphaNum::cmAlphaNum(&local_a60,config_local);
  cmStrCat<char[13]>(&local_a00,&local_a30,&local_a60,(char (*) [13])0xd5953f);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_a00);
  local_9e0 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
  local_a80 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("MSVC",4);
  local_a70 = local_a80;
  bVar3 = std::operator==(local_9e0,local_a80);
  if (bVar3) {
LAB_003e1b86:
    bVar3 = cmSystemTools::GetErrorOccurredFlag();
    local_f89 = bVar3 ^ 0xff;
  }
  else {
    pcVar1 = this->Makefile;
    cmAlphaNum::cmAlphaNum(&local_ae0,"CMAKE_");
    cmAlphaNum::cmAlphaNum(&local_b10,config_local);
    cmStrCat<char[13]>(&local_ab0,&local_ae0,&local_b10,(char (*) [13])0xd2cfef);
    local_b11 = 1;
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_ab0);
    local_a90 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
    local_b38 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("MSVC",4);
    local_b28 = local_b38;
    bVar3 = std::operator==(local_a90,local_b38);
    local_f89 = 0;
    if (bVar3) goto LAB_003e1b86;
  }
  if ((local_b11 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_ab0);
  }
  std::__cxx11::string::~string((string *)&local_a00);
  if ((local_f89 & 1) != 0) {
    cmAlphaNum::cmAlphaNum(&local_b88,"MSVC_DEBUG_INFORMATION_FORMAT value \'");
    pbVar8 = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&msvcDebugInformationFormatOptions);
    cmAlphaNum::cmAlphaNum(&local_bb8,pbVar8);
    cmStrCat<char[22],std::__cxx11::string,char[11]>
              (&local_b58,&local_b88,&local_bb8,(char (*) [22])"\' not known for this ",config_local
               ,(char (*) [11])0xd36475);
    IssueMessage(this,FATAL_ERROR,&local_b58);
    std::__cxx11::string::~string((string *)&local_b58);
  }
LAB_003e1cda:
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&msvcDebugInformationFormatOptions);
  std::__cxx11::string::~string((string *)local_188);
  std::__cxx11::string::~string((string *)local_e8);
  return;
}

Assistant:

void cmLocalGenerator::AddLanguageFlags(std::string& flags,
                                        cmGeneratorTarget const* target,
                                        cmBuildStep compileOrLink,
                                        const std::string& lang,
                                        const std::string& config)
{
  // Add language-specific flags.
  this->AddConfigVariableFlags(flags, cmStrCat("CMAKE_", lang, "_FLAGS"),
                               config);

  std::string compiler = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILER_ID"));

  std::string compilerSimulateId = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_SIMULATE_ID"));

  if (lang == "Swift") {
    if (cmValue v = target->GetProperty("Swift_LANGUAGE_VERSION")) {
      if (cmSystemTools::VersionCompare(
            cmSystemTools::OP_GREATER_EQUAL,
            this->Makefile->GetDefinition("CMAKE_Swift_COMPILER_VERSION"),
            "4.2")) {
        this->AppendFlags(flags, "-swift-version " + *v);
      }
    }
  } else if (lang == "CUDA") {
    target->AddCUDAArchitectureFlags(compileOrLink, config, flags);
    target->AddCUDAToolkitFlags(flags);
  } else if (lang == "ISPC") {
    target->AddISPCTargetFlags(flags);
  } else if (lang == "RC" &&
             this->Makefile->GetSafeDefinition("CMAKE_RC_COMPILER")
                 .find("llvm-rc") != std::string::npos) {
    compiler = this->Makefile->GetSafeDefinition("CMAKE_C_COMPILER_ID");
    if (!compiler.empty()) {
      compilerSimulateId =
        this->Makefile->GetSafeDefinition("CMAKE_C_SIMULATE_ID");
    } else {
      compiler = this->Makefile->GetSafeDefinition("CMAKE_CXX_COMPILER_ID");
      compilerSimulateId =
        this->Makefile->GetSafeDefinition("CMAKE_CXX_SIMULATE_ID");
    }
  } else if (lang == "HIP") {
    target->AddHIPArchitectureFlags(flags);
  }

  // Add VFS Overlay for Clang compilers
  if (compiler == "Clang") {
    if (cmValue vfsOverlay =
          this->Makefile->GetDefinition("CMAKE_CLANG_VFS_OVERLAY")) {
      if (compilerSimulateId == "MSVC") {
        this->AppendCompileOptions(
          flags,
          std::vector<std::string>{ "-Xclang", "-ivfsoverlay", "-Xclang",
                                    *vfsOverlay });
      } else {
        this->AppendCompileOptions(
          flags, std::vector<std::string>{ "-ivfsoverlay", *vfsOverlay });
      }
    }
  }
  // Add MSVC runtime library flags.  This is activated by the presence
  // of a default selection whether or not it is overridden by a property.
  cmValue msvcRuntimeLibraryDefault =
    this->Makefile->GetDefinition("CMAKE_MSVC_RUNTIME_LIBRARY_DEFAULT");
  if (cmNonempty(msvcRuntimeLibraryDefault)) {
    cmValue msvcRuntimeLibraryValue =
      target->GetProperty("MSVC_RUNTIME_LIBRARY");
    if (!msvcRuntimeLibraryValue) {
      msvcRuntimeLibraryValue = msvcRuntimeLibraryDefault;
    }
    std::string const msvcRuntimeLibrary = cmGeneratorExpression::Evaluate(
      *msvcRuntimeLibraryValue, this, config, target);
    if (!msvcRuntimeLibrary.empty()) {
      if (cmValue msvcRuntimeLibraryOptions = this->Makefile->GetDefinition(
            "CMAKE_" + lang + "_COMPILE_OPTIONS_MSVC_RUNTIME_LIBRARY_" +
            msvcRuntimeLibrary)) {
        this->AppendCompileOptions(flags, *msvcRuntimeLibraryOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_COMPILER_ID") == "MSVC" ||
                  this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_SIMULATE_ID") == "MSVC") &&
                 !cmSystemTools::GetErrorOccurredFlag()) {
        // The compiler uses the MSVC ABI so it needs a known runtime library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           "MSVC_RUNTIME_LIBRARY value '" +
                             msvcRuntimeLibrary + "' not known for this " +
                             lang + " compiler.");
      }
    }
  }

  // Add Watcom runtime library flags.  This is activated by the presence
  // of a default selection whether or not it is overridden by a property.
  cmValue watcomRuntimeLibraryDefault =
    this->Makefile->GetDefinition("CMAKE_WATCOM_RUNTIME_LIBRARY_DEFAULT");
  if (cmNonempty(watcomRuntimeLibraryDefault)) {
    cmValue watcomRuntimeLibraryValue =
      target->GetProperty("WATCOM_RUNTIME_LIBRARY");
    if (!watcomRuntimeLibraryValue) {
      watcomRuntimeLibraryValue = watcomRuntimeLibraryDefault;
    }
    std::string const watcomRuntimeLibrary = cmGeneratorExpression::Evaluate(
      *watcomRuntimeLibraryValue, this, config, target);
    if (!watcomRuntimeLibrary.empty()) {
      if (cmValue watcomRuntimeLibraryOptions = this->Makefile->GetDefinition(
            "CMAKE_" + lang + "_COMPILE_OPTIONS_WATCOM_RUNTIME_LIBRARY_" +
            watcomRuntimeLibrary)) {
        this->AppendCompileOptions(flags, *watcomRuntimeLibraryOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_COMPILER_ID") == "OpenWatcom" ||
                  this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_SIMULATE_ID") == "OpenWatcom") &&
                 !cmSystemTools::GetErrorOccurredFlag()) {
        // The compiler uses the Watcom ABI so it needs a known runtime
        // library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           "WATCOM_RUNTIME_LIBRARY value '" +
                             watcomRuntimeLibrary + "' not known for this " +
                             lang + " compiler.");
      }
    }
  }

  // Add MSVC debug information format flags if CMP0141 is NEW.
  if (cm::optional<std::string> msvcDebugInformationFormat =
        this->GetMSVCDebugFormatName(config, target)) {
    if (!msvcDebugInformationFormat->empty()) {
      if (cmValue msvcDebugInformationFormatOptions =
            this->Makefile->GetDefinition(
              cmStrCat("CMAKE_", lang,
                       "_COMPILE_OPTIONS_MSVC_DEBUG_INFORMATION_FORMAT_",
                       *msvcDebugInformationFormat))) {
        this->AppendCompileOptions(flags, *msvcDebugInformationFormatOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_COMPILER_ID")) == "MSVC"_s ||
                  this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_SIMULATE_ID")) == "MSVC"_s) &&
                 !cmSystemTools::GetErrorOccurredFlag()) {
        // The compiler uses the MSVC ABI so it needs a known runtime library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           cmStrCat("MSVC_DEBUG_INFORMATION_FORMAT value '",
                                    *msvcDebugInformationFormat,
                                    "' not known for this ", lang,
                                    " compiler."));
      }
    }
  }
}